

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

wchar_t assertion_equal_wstring
                  (char *file,wchar_t line,wchar_t *v1,char *e1,wchar_t *v2,char *e2,void *extra)

{
  int iVar1;
  wchar_t wVar2;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  wVar2 = L'\x01';
  if (v1 != v2) {
    if ((v2 != (wchar_t *)0x0 && v1 != (wchar_t *)0x0) && (iVar1 = wcscmp(v1,v2), iVar1 == 0)) {
      return L'\x01';
    }
    wVar2 = L'\0';
    failure_start(file,line,"%s != %s",e1,e2);
    wcsdump(e1,v1);
    wcsdump(e2,v2);
    failure_finish(extra);
  }
  return wVar2;
}

Assistant:

int
assertion_equal_wstring(const char *file, int line,
    const wchar_t *v1, const char *e1,
    const wchar_t *v2, const char *e2,
    void *extra)
{
	assertion_count(file, line);
	if (v1 == v2)
		return (1);
	if (v1 != NULL && v2 != NULL && wcscmp(v1, v2) == 0)
		return (1);
	failure_start(file, line, "%s != %s", e1, e2);
	wcsdump(e1, v1);
	wcsdump(e2, v2);
	failure_finish(extra);
	return (0);
}